

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  byte bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [12];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar26;
  undefined4 uVar27;
  int iVar28;
  int iVar29;
  undefined4 uVar30;
  long lVar31;
  ulong uVar32;
  RTCRayN *pRVar33;
  undefined4 uVar35;
  ulong uVar36;
  long lVar37;
  byte bVar38;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  long lVar48;
  float fVar49;
  uint uVar50;
  float fVar51;
  float fVar52;
  float fVar71;
  float fVar75;
  vint4 ai;
  uint uVar72;
  uint uVar76;
  float fVar79;
  uint uVar80;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar73;
  float fVar74;
  float fVar77;
  float fVar78;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar68;
  undefined1 auVar69 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar70;
  byte bVar84;
  float fVar85;
  byte bVar100;
  byte bVar101;
  byte bVar103;
  float fVar104;
  byte bVar107;
  byte bVar108;
  float fVar109;
  vint4 ai_1;
  uint uVar86;
  uint uVar105;
  uint uVar110;
  float fVar111;
  uint uVar112;
  StackItemT<embree::NodeRefPtr<4>_> SVar88;
  byte bVar102;
  undefined1 auVar89 [16];
  float fVar87;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar106;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar113;
  vint4 ai_2;
  StackItemT<embree::NodeRefPtr<4>_> SVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar123;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar124;
  uint uVar125;
  float fVar126;
  float fVar134;
  float fVar137;
  vint4 ai_3;
  uint uVar135;
  uint uVar138;
  float fVar140;
  uint uVar141;
  undefined1 auVar127 [16];
  float fVar136;
  float fVar139;
  float fVar142;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  vint4 bi_3;
  undefined1 auVar143 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar151;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar152;
  float fVar157;
  float fVar158;
  vint4 bi_4;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar159;
  undefined1 auVar156 [16];
  float fVar160;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar166;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar175;
  int iVar176;
  float fVar177;
  int iVar178;
  float fVar179;
  int iVar180;
  float fVar181;
  float fVar182;
  int iVar183;
  float fVar184;
  int iVar185;
  float fVar186;
  int iVar187;
  vint4 bi_1;
  float fVar188;
  int iVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar194 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined8 local_13a8;
  float fStack_13a0;
  float fStack_139c;
  float fStack_1380;
  float fStack_137c;
  undefined1 local_1348 [8];
  float fStack_1340;
  float fStack_133c;
  vbool<4> valid;
  undefined1 local_1318 [16];
  long local_1308;
  Scene *local_1300;
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  RTCFilterFunctionNArguments args;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  undefined4 uStack_127c;
  float fStack_125c;
  vfloat<4> tNear;
  float local_11d8 [4];
  float local_11c8 [4];
  undefined1 local_11b8 [16];
  float local_11a8 [4];
  undefined1 local_1198 [16];
  undefined8 local_1188;
  undefined8 uStack_1180;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  undefined8 local_1138;
  ulong local_1130;
  ulong local_1128;
  ulong local_1120;
  ulong local_1118;
  ulong local_1110;
  ulong local_1108;
  long local_1100;
  long local_10f8;
  long local_10f0;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  int local_10c8;
  int iStack_10c4;
  int iStack_10c0;
  int iStack_10bc;
  int local_10b8;
  int iStack_10b4;
  int iStack_10b0;
  int iStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  uint local_1018;
  uint uStack_1014;
  uint uStack_1010;
  uint uStack_100c;
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar34;
  
  local_1138 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar81 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar166 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar27 = *(undefined4 *)((long)&(tray->rdir).field_0 + k * 4);
  auVar173._4_4_ = uVar27;
  auVar173._0_4_ = uVar27;
  auVar173._8_4_ = uVar27;
  auVar173._12_4_ = uVar27;
  fVar160 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar52 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar28 = (tray->tnear).field_0.i[k];
  iVar189 = (tray->tfar).field_0.i[k];
  local_1108 = uVar43 >> 2;
  local_1110 = (uVar43 ^ 0x10) >> 2;
  local_1118 = uVar45 >> 2;
  local_1120 = (uVar45 ^ 0x10) >> 2;
  local_1128 = uVar41 >> 2;
  local_1130 = (uVar41 ^ 0x10) >> 2;
  lVar31 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_1178 = fVar81;
  fStack_1174 = fVar81;
  fStack_1170 = fVar81;
  fStack_116c = fVar81;
  local_fc8 = fVar166;
  fStack_fc4 = fVar166;
  fStack_fc0 = fVar166;
  fStack_fbc = fVar166;
  local_1008 = auVar173;
  local_fd8 = fVar160;
  fStack_fd4 = fVar160;
  fStack_fd0 = fVar160;
  fStack_fcc = fVar160;
  local_fe8 = fVar52;
  fStack_fe4 = fVar52;
  fStack_fe0 = fVar52;
  fStack_fdc = fVar52;
  local_10c8 = iVar28;
  iStack_10c4 = iVar28;
  iStack_10c0 = iVar28;
  iStack_10bc = iVar28;
  pSVar39 = local_1138;
  fVar123 = fVar81;
  fVar113 = fVar81;
  fVar151 = fVar81;
  fVar106 = fVar166;
  fVar87 = fVar166;
  fVar82 = fVar166;
  fVar77 = fVar52;
  fVar73 = fVar52;
  fVar51 = fVar52;
  fVar83 = fVar160;
  fVar78 = fVar160;
  fVar74 = fVar160;
  iVar187 = iVar189;
  iVar185 = iVar189;
  iVar183 = iVar189;
  iVar180 = iVar28;
  iVar178 = iVar28;
  iVar176 = iVar28;
LAB_00299d63:
  do {
    pSVar26 = local_1138 + -1;
    local_1138 = local_1138 + -1;
    if ((float)pSVar26->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar26->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar46 = (local_1138->ptr).ptr;
      while ((uVar46 & 8) == 0) {
        pfVar2 = (float *)(uVar46 + 0x20 + uVar43);
        fVar49 = (*pfVar2 - fVar81) * auVar173._0_4_;
        fVar71 = (pfVar2[1] - fVar123) * auVar173._4_4_;
        fVar75 = (pfVar2[2] - fVar113) * auVar173._8_4_;
        fVar79 = (pfVar2[3] - fVar151) * auVar173._12_4_;
        pfVar2 = (float *)(uVar46 + 0x20 + uVar45);
        fVar85 = (*pfVar2 - fVar3) * fVar74;
        fVar104 = (pfVar2[1] - fVar3) * fVar78;
        fVar109 = (pfVar2[2] - fVar3) * fVar83;
        fVar111 = (pfVar2[3] - fVar3) * fVar160;
        uVar86 = (uint)((int)fVar85 < (int)fVar49) * (int)fVar49 |
                 (uint)((int)fVar85 >= (int)fVar49) * (int)fVar85;
        uVar105 = (uint)((int)fVar104 < (int)fVar71) * (int)fVar71 |
                  (uint)((int)fVar104 >= (int)fVar71) * (int)fVar104;
        uVar110 = (uint)((int)fVar109 < (int)fVar75) * (int)fVar75 |
                  (uint)((int)fVar109 >= (int)fVar75) * (int)fVar109;
        uVar112 = (uint)((int)fVar111 < (int)fVar79) * (int)fVar79 |
                  (uint)((int)fVar111 >= (int)fVar79) * (int)fVar111;
        pfVar2 = (float *)(uVar46 + 0x20 + uVar41);
        fVar49 = (*pfVar2 - fVar82) * fVar51;
        fVar71 = (pfVar2[1] - fVar87) * fVar73;
        fVar75 = (pfVar2[2] - fVar106) * fVar77;
        fVar79 = (pfVar2[3] - fVar166) * fVar52;
        pfVar2 = (float *)(uVar46 + 0x20 + (uVar43 ^ 0x10));
        fVar85 = (*pfVar2 - fVar81) * auVar173._0_4_;
        fVar104 = (pfVar2[1] - fVar123) * auVar173._4_4_;
        fVar109 = (pfVar2[2] - fVar113) * auVar173._8_4_;
        fVar111 = (pfVar2[3] - fVar151) * auVar173._12_4_;
        pfVar2 = (float *)(uVar46 + 0x20 + (uVar45 ^ 0x10));
        fVar124 = (*pfVar2 - fVar3) * fVar74;
        fVar134 = (pfVar2[1] - fVar3) * fVar78;
        fVar137 = (pfVar2[2] - fVar3) * fVar83;
        fVar140 = (pfVar2[3] - fVar3) * fVar160;
        uVar125 = (uint)((int)fVar85 < (int)fVar124) * (int)fVar85 |
                  (uint)((int)fVar85 >= (int)fVar124) * (int)fVar124;
        uVar135 = (uint)((int)fVar104 < (int)fVar134) * (int)fVar104 |
                  (uint)((int)fVar104 >= (int)fVar134) * (int)fVar134;
        uVar138 = (uint)((int)fVar109 < (int)fVar137) * (int)fVar109 |
                  (uint)((int)fVar109 >= (int)fVar137) * (int)fVar137;
        uVar141 = (uint)((int)fVar111 < (int)fVar140) * (int)fVar111 |
                  (uint)((int)fVar111 >= (int)fVar140) * (int)fVar140;
        pfVar2 = (float *)(uVar46 + 0x20 + (uVar41 ^ 0x10));
        fVar85 = (*pfVar2 - fVar82) * fVar51;
        fVar104 = (pfVar2[1] - fVar87) * fVar73;
        fVar109 = (pfVar2[2] - fVar106) * fVar77;
        fVar111 = (pfVar2[3] - fVar166) * fVar52;
        uVar50 = (uint)((int)fVar49 < iVar176) * iVar176 |
                 (uint)((int)fVar49 >= iVar176) * (int)fVar49;
        uVar72 = (uint)((int)fVar71 < iVar178) * iVar178 |
                 (uint)((int)fVar71 >= iVar178) * (int)fVar71;
        uVar76 = (uint)((int)fVar75 < iVar180) * iVar180 |
                 (uint)((int)fVar75 >= iVar180) * (int)fVar75;
        uVar80 = (uint)((int)fVar79 < iVar28) * iVar28 | (uint)((int)fVar79 >= iVar28) * (int)fVar79
        ;
        tNear.field_0.i[0] =
             ((int)uVar50 < (int)uVar86) * uVar86 | ((int)uVar50 >= (int)uVar86) * uVar50;
        tNear.field_0.i[1] =
             ((int)uVar72 < (int)uVar105) * uVar105 | ((int)uVar72 >= (int)uVar105) * uVar72;
        tNear.field_0.i[2] =
             ((int)uVar76 < (int)uVar110) * uVar110 | ((int)uVar76 >= (int)uVar110) * uVar76;
        tNear.field_0.i[3] =
             ((int)uVar80 < (int)uVar112) * uVar112 | ((int)uVar80 >= (int)uVar112) * uVar80;
        uVar50 = (uint)(iVar183 < (int)fVar85) * iVar183 |
                 (uint)(iVar183 >= (int)fVar85) * (int)fVar85;
        uVar72 = (uint)(iVar185 < (int)fVar104) * iVar185 |
                 (uint)(iVar185 >= (int)fVar104) * (int)fVar104;
        uVar76 = (uint)(iVar187 < (int)fVar109) * iVar187 |
                 (uint)(iVar187 >= (int)fVar109) * (int)fVar109;
        uVar80 = (uint)(iVar189 < (int)fVar111) * iVar189 |
                 (uint)(iVar189 >= (int)fVar111) * (int)fVar111;
        auVar60._0_4_ =
             -(uint)((int)(((int)uVar125 < (int)uVar50) * uVar125 |
                          ((int)uVar125 >= (int)uVar50) * uVar50) < tNear.field_0.i[0]);
        auVar60._4_4_ =
             -(uint)((int)(((int)uVar135 < (int)uVar72) * uVar135 |
                          ((int)uVar135 >= (int)uVar72) * uVar72) < tNear.field_0.i[1]);
        auVar60._8_4_ =
             -(uint)((int)(((int)uVar138 < (int)uVar76) * uVar138 |
                          ((int)uVar138 >= (int)uVar76) * uVar76) < tNear.field_0.i[2]);
        auVar60._12_4_ =
             -(uint)((int)(((int)uVar141 < (int)uVar80) * uVar141 |
                          ((int)uVar141 >= (int)uVar80) * uVar80) < tNear.field_0.i[3]);
        uVar50 = movmskps((int)pSVar39,auVar60);
        if (uVar50 == 0xf) {
          pSVar39 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)uVar50;
          if (local_1138 == stack) {
            return;
          }
          goto LAB_00299d63;
        }
        bVar38 = (byte)uVar50 ^ 0xf;
        uVar36 = uVar46 & 0xfffffffffffffff0;
        lVar37 = 0;
        if (bVar38 != 0) {
          for (; (bVar38 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
          }
        }
        uVar46 = *(ulong *)(uVar36 + lVar37 * 8);
        uVar50 = bVar38 - 1 & (uint)bVar38;
        pSVar39 = local_1138;
        if (uVar50 != 0) {
          uVar72 = tNear.field_0.i[lVar37];
          lVar37 = 0;
          if (uVar50 != 0) {
            for (; (uVar50 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
            }
          }
          uVar34 = *(ulong *)(uVar36 + lVar37 * 8);
          uVar76 = tNear.field_0.i[lVar37];
          uVar50 = uVar50 - 1 & uVar50;
          if (uVar50 == 0) {
            pSVar39 = local_1138 + 1;
            if (uVar72 < uVar76) {
              (local_1138->ptr).ptr = uVar34;
              local_1138->dist = uVar76;
              local_1138 = pSVar39;
            }
            else {
              (local_1138->ptr).ptr = uVar46;
              local_1138->dist = uVar72;
              local_1138 = pSVar39;
              uVar46 = uVar34;
            }
          }
          else {
            auVar64._8_4_ = uVar72;
            auVar64._0_8_ = uVar46;
            auVar64._12_4_ = 0;
            auVar91._8_4_ = uVar76;
            auVar91._0_8_ = uVar34;
            auVar91._12_4_ = 0;
            lVar37 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            uVar5 = *(undefined8 *)(uVar36 + lVar37 * 8);
            iVar29 = tNear.field_0.i[lVar37];
            auVar146._8_4_ = iVar29;
            auVar146._0_8_ = uVar5;
            auVar146._12_4_ = 0;
            auVar117._8_4_ = -(uint)((int)uVar72 < (int)uVar76);
            uVar50 = uVar50 - 1 & uVar50;
            if (uVar50 == 0) {
              auVar117._4_4_ = auVar117._8_4_;
              auVar117._0_4_ = auVar117._8_4_;
              auVar117._12_4_ = auVar117._8_4_;
              auVar143._8_4_ = uVar76;
              auVar143._0_8_ = uVar34;
              auVar143._12_4_ = 0;
              auVar155 = blendvps(auVar143,auVar64,auVar117);
              auVar60 = blendvps(auVar64,auVar91,auVar117);
              auVar53._8_4_ = -(uint)(auVar155._8_4_ < iVar29);
              auVar53._4_4_ = auVar53._8_4_;
              auVar53._0_4_ = auVar53._8_4_;
              auVar53._12_4_ = auVar53._8_4_;
              auVar127._8_4_ = iVar29;
              auVar127._0_8_ = uVar5;
              auVar127._12_4_ = 0;
              auVar64 = blendvps(auVar127,auVar155,auVar53);
              auVar91 = blendvps(auVar155,auVar146,auVar53);
              auVar54._8_4_ = -(uint)(auVar60._8_4_ < auVar91._8_4_);
              auVar54._4_4_ = auVar54._8_4_;
              auVar54._0_4_ = auVar54._8_4_;
              auVar54._12_4_ = auVar54._8_4_;
              SVar114 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar91,auVar60,auVar54);
              SVar88 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar60,auVar91,auVar54);
              *local_1138 = SVar88;
              local_1138[1] = SVar114;
              uVar46 = auVar64._0_8_;
              local_1138 = local_1138 + 2;
              pSVar39 = local_1138;
            }
            else {
              lVar37 = 0;
              if (uVar50 != 0) {
                for (; (uVar50 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
              auVar155._4_4_ = auVar117._8_4_;
              auVar155._0_4_ = auVar117._8_4_;
              auVar155._8_4_ = auVar117._8_4_;
              auVar155._12_4_ = auVar117._8_4_;
              auVar117 = blendvps(auVar91,auVar64,auVar155);
              auVar60 = blendvps(auVar64,auVar91,auVar155);
              auVar153._8_4_ = tNear.field_0.i[lVar37];
              auVar153._0_8_ = *(undefined8 *)(uVar36 + lVar37 * 8);
              auVar153._12_4_ = 0;
              auVar55._8_4_ = -(uint)(iVar29 < tNear.field_0.i[lVar37]);
              auVar55._4_4_ = auVar55._8_4_;
              auVar55._0_4_ = auVar55._8_4_;
              auVar55._12_4_ = auVar55._8_4_;
              auVar91 = blendvps(auVar153,auVar146,auVar55);
              auVar64 = blendvps(auVar146,auVar153,auVar55);
              auVar56._8_4_ = -(uint)(auVar60._8_4_ < auVar64._8_4_);
              auVar56._4_4_ = auVar56._8_4_;
              auVar56._0_4_ = auVar56._8_4_;
              auVar56._12_4_ = auVar56._8_4_;
              auVar146 = blendvps(auVar64,auVar60,auVar56);
              SVar88 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar60,auVar64,auVar56);
              auVar57._8_4_ = -(uint)(auVar117._8_4_ < auVar91._8_4_);
              auVar57._4_4_ = auVar57._8_4_;
              auVar57._0_4_ = auVar57._8_4_;
              auVar57._12_4_ = auVar57._8_4_;
              auVar60 = blendvps(auVar91,auVar117,auVar57);
              auVar64 = blendvps(auVar117,auVar91,auVar57);
              auVar58._8_4_ = -(uint)(auVar64._8_4_ < auVar146._8_4_);
              auVar58._4_4_ = auVar58._8_4_;
              auVar58._0_4_ = auVar58._8_4_;
              auVar58._12_4_ = auVar58._8_4_;
              SVar114 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar146,auVar64,auVar58);
              SVar144 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar64,auVar146,auVar58);
              *local_1138 = SVar88;
              local_1138[1] = SVar144;
              local_1138[2] = SVar114;
              uVar46 = auVar60._0_8_;
              local_1138 = local_1138 + 3;
              pSVar39 = local_1138;
              fVar81 = local_1178;
              fVar123 = fStack_1174;
              fVar113 = fStack_1170;
              fVar151 = fStack_116c;
            }
          }
        }
      }
      local_1100 = (ulong)((uint)uVar46 & 0xf) - 8;
      if (local_1100 != 0) {
        uVar46 = uVar46 & 0xfffffffffffffff0;
        local_10f8 = 0;
        local_10b8 = iVar183;
        iStack_10b4 = iVar185;
        iStack_10b0 = iVar187;
        iStack_10ac = iVar189;
        do {
          lVar37 = local_10f8 * 0x58;
          local_10f0 = uVar46 + lVar37;
          uVar36 = *(ulong *)(uVar46 + 0x20 + lVar37);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar36;
          uVar5 = *(undefined8 *)(uVar46 + 0x24 + lVar37);
          bVar38 = (byte)uVar36;
          bVar84 = (byte)uVar5;
          bVar11 = (byte)(uVar36 >> 8);
          bVar100 = (byte)((ulong)uVar5 >> 8);
          bVar12 = (byte)(uVar36 >> 0x10);
          bVar101 = (byte)((ulong)uVar5 >> 0x10);
          bVar13 = (byte)(uVar36 >> 0x18);
          bVar102 = (byte)((ulong)uVar5 >> 0x18);
          bVar14 = (byte)(uVar36 >> 0x20);
          bVar103 = (byte)((ulong)uVar5 >> 0x20);
          bVar15 = (byte)(uVar36 >> 0x28);
          bVar107 = (byte)((ulong)uVar5 >> 0x28);
          bVar16 = (byte)(uVar36 >> 0x30);
          bVar108 = (byte)((ulong)uVar5 >> 0x30);
          bVar20 = (byte)((ulong)uVar5 >> 0x38);
          bVar17 = (byte)(uVar36 >> 0x38);
          auVar89[0] = -((byte)((bVar38 < bVar84) * bVar38 | (bVar38 >= bVar84) * bVar84) == bVar38)
          ;
          auVar89[1] = -((byte)((bVar11 < bVar100) * bVar11 | (bVar11 >= bVar100) * bVar100) ==
                        bVar11);
          auVar89[2] = -((byte)((bVar12 < bVar101) * bVar12 | (bVar12 >= bVar101) * bVar101) ==
                        bVar12);
          auVar89[3] = -((byte)((bVar13 < bVar102) * bVar13 | (bVar13 >= bVar102) * bVar102) ==
                        bVar13);
          auVar89[4] = -((byte)((bVar14 < bVar103) * bVar14 | (bVar14 >= bVar103) * bVar103) ==
                        bVar14);
          auVar89[5] = -((byte)((bVar15 < bVar107) * bVar15 | (bVar15 >= bVar107) * bVar107) ==
                        bVar15);
          auVar89[6] = -((byte)((bVar16 < bVar108) * bVar16 | (bVar16 >= bVar108) * bVar108) ==
                        bVar16);
          auVar89[7] = -((byte)((bVar17 < bVar20) * bVar17 | (bVar17 >= bVar20) * bVar20) == bVar17)
          ;
          auVar89[8] = 0xff;
          auVar89[9] = 0xff;
          auVar89[10] = 0xff;
          auVar89[0xb] = 0xff;
          auVar89[0xc] = 0xff;
          auVar89[0xd] = 0xff;
          auVar89[0xe] = 0xff;
          auVar89[0xf] = 0xff;
          auVar115._8_4_ = 0xffffffff;
          auVar115._0_8_ = 0xffffffffffffffff;
          auVar115._12_4_ = 0xffffffff;
          auVar60 = pmovzxbd(auVar59,auVar89 ^ auVar115);
          auVar60 = auVar60 ^ auVar115;
          auVar61._0_4_ = auVar60._0_4_ << 0x1f;
          auVar61._4_4_ = auVar60._4_4_ << 0x1f;
          auVar61._8_4_ = auVar60._8_4_ << 0x1f;
          auVar61._12_4_ = auVar60._12_4_ << 0x1f;
          uVar27 = movmskps((int)local_10f8,auVar61);
          fVar81 = *(float *)(uVar46 + 0x38 + lVar37);
          fVar123 = *(float *)(uVar46 + 0x3c + lVar37);
          fVar113 = *(float *)(uVar46 + 0x44 + lVar37);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)(local_1108 + 0x20 + local_10f0);
          auVar60 = pmovzxbd(auVar62,auVar62);
          auVar63._8_8_ = 0;
          auVar63._0_8_ = *(ulong *)(local_1110 + 0x20 + local_10f0);
          auVar64 = pmovzxbd(auVar63,auVar63);
          fVar151 = *(float *)(uVar46 + 0x48 + lVar37);
          auVar90._8_8_ = 0;
          auVar90._0_8_ = *(ulong *)(local_1118 + 0x20 + local_10f0);
          auVar91 = pmovzxbd(auVar90,auVar90);
          auVar116._8_8_ = 0;
          auVar116._0_8_ = *(ulong *)(local_1120 + 0x20 + local_10f0);
          auVar117 = pmovzxbd(auVar116,auVar116);
          fVar49 = *(float *)(uVar46 + 0x4c + lVar37);
          auVar145._8_8_ = 0;
          auVar145._0_8_ = *(ulong *)(local_1128 + 0x20 + local_10f0);
          auVar146 = pmovzxbd(auVar145,auVar145);
          auVar154._8_8_ = 0;
          auVar154._0_8_ = *(ulong *)(local_1130 + 0x20 + local_10f0);
          auVar155 = pmovzxbd(auVar154,auVar154);
          fVar71 = *(float *)(uVar46 + 0x40 + lVar37);
          fVar109 = (((float)auVar60._0_4_ * fVar113 + fVar81) - local_1178) * auVar173._0_4_;
          fVar111 = (((float)auVar60._4_4_ * fVar113 + fVar81) - fStack_1174) * auVar173._4_4_;
          fVar124 = (((float)auVar60._8_4_ * fVar113 + fVar81) - fStack_1170) * auVar173._8_4_;
          fVar134 = (((float)auVar60._12_4_ * fVar113 + fVar81) - fStack_116c) * auVar173._12_4_;
          fVar75 = (((float)auVar91._0_4_ * fVar151 + fVar123) - fVar3) * fVar74;
          fVar79 = (((float)auVar91._4_4_ * fVar151 + fVar123) - fVar3) * fVar78;
          fVar85 = (((float)auVar91._8_4_ * fVar151 + fVar123) - fVar3) * fVar83;
          fVar104 = (((float)auVar91._12_4_ * fVar151 + fVar123) - fVar3) * fVar160;
          uVar50 = (uint)((int)fVar75 < (int)fVar109) * (int)fVar109 |
                   (uint)((int)fVar75 >= (int)fVar109) * (int)fVar75;
          uVar72 = (uint)((int)fVar79 < (int)fVar111) * (int)fVar111 |
                   (uint)((int)fVar79 >= (int)fVar111) * (int)fVar79;
          uVar76 = (uint)((int)fVar85 < (int)fVar124) * (int)fVar124 |
                   (uint)((int)fVar85 >= (int)fVar124) * (int)fVar85;
          uVar80 = (uint)((int)fVar104 < (int)fVar134) * (int)fVar134 |
                   (uint)((int)fVar104 >= (int)fVar134) * (int)fVar104;
          fVar75 = (((float)auVar64._0_4_ * fVar113 + fVar81) - local_1178) * auVar173._0_4_;
          fVar79 = (((float)auVar64._4_4_ * fVar113 + fVar81) - fStack_1174) * auVar173._4_4_;
          fVar85 = (((float)auVar64._8_4_ * fVar113 + fVar81) - fStack_1170) * auVar173._8_4_;
          fVar81 = (((float)auVar64._12_4_ * fVar113 + fVar81) - fStack_116c) * auVar173._12_4_;
          fVar113 = (((float)auVar117._0_4_ * fVar151 + fVar123) - fVar3) * fVar74;
          fVar104 = (((float)auVar117._4_4_ * fVar151 + fVar123) - fVar3) * fVar78;
          fVar109 = (((float)auVar117._8_4_ * fVar151 + fVar123) - fVar3) * fVar83;
          fVar123 = (((float)auVar117._12_4_ * fVar151 + fVar123) - fVar3) * fVar160;
          uVar86 = (uint)((int)fVar75 < (int)fVar113) * (int)fVar75 |
                   (uint)((int)fVar75 >= (int)fVar113) * (int)fVar113;
          uVar105 = (uint)((int)fVar79 < (int)fVar104) * (int)fVar79 |
                    (uint)((int)fVar79 >= (int)fVar104) * (int)fVar104;
          uVar110 = (uint)((int)fVar85 < (int)fVar109) * (int)fVar85 |
                    (uint)((int)fVar85 >= (int)fVar109) * (int)fVar109;
          uVar112 = (uint)((int)fVar81 < (int)fVar123) * (int)fVar81 |
                    (uint)((int)fVar81 >= (int)fVar123) * (int)fVar123;
          fVar81 = (((float)auVar146._0_4_ * fVar49 + fVar71) - fVar82) * fVar51;
          fVar123 = (((float)auVar146._4_4_ * fVar49 + fVar71) - fVar87) * fVar73;
          fVar113 = (((float)auVar146._8_4_ * fVar49 + fVar71) - fVar106) * fVar77;
          fVar151 = (((float)auVar146._12_4_ * fVar49 + fVar71) - fVar166) * fVar52;
          uVar125 = (uint)((int)fVar81 < iVar176) * iVar176 |
                    (uint)((int)fVar81 >= iVar176) * (int)fVar81;
          uVar135 = (uint)((int)fVar123 < iVar178) * iVar178 |
                    (uint)((int)fVar123 >= iVar178) * (int)fVar123;
          uVar138 = (uint)((int)fVar113 < iVar180) * iVar180 |
                    (uint)((int)fVar113 >= iVar180) * (int)fVar113;
          uVar141 = (uint)((int)fVar151 < iVar28) * iVar28 |
                    (uint)((int)fVar151 >= iVar28) * (int)fVar151;
          dist.field_0.i[0] =
               ((int)uVar125 < (int)uVar50) * uVar50 | ((int)uVar125 >= (int)uVar50) * uVar125;
          dist.field_0.i[1] =
               ((int)uVar135 < (int)uVar72) * uVar72 | ((int)uVar135 >= (int)uVar72) * uVar135;
          dist.field_0.i[2] =
               ((int)uVar138 < (int)uVar76) * uVar76 | ((int)uVar138 >= (int)uVar76) * uVar138;
          dist.field_0.i[3] =
               ((int)uVar141 < (int)uVar80) * uVar80 | ((int)uVar141 >= (int)uVar80) * uVar141;
          fVar81 = (((float)auVar155._0_4_ * fVar49 + fVar71) - fVar82) * fVar51;
          fVar123 = (((float)auVar155._4_4_ * fVar49 + fVar71) - fVar87) * fVar73;
          fVar113 = (((float)auVar155._8_4_ * fVar49 + fVar71) - fVar106) * fVar77;
          fVar151 = (((float)auVar155._12_4_ * fVar49 + fVar71) - fVar166) * fVar52;
          uVar50 = (uint)(iVar183 < (int)fVar81) * iVar183 |
                   (uint)(iVar183 >= (int)fVar81) * (int)fVar81;
          uVar72 = (uint)(iVar185 < (int)fVar123) * iVar185 |
                   (uint)(iVar185 >= (int)fVar123) * (int)fVar123;
          uVar76 = (uint)(iVar187 < (int)fVar113) * iVar187 |
                   (uint)(iVar187 >= (int)fVar113) * (int)fVar113;
          uVar80 = (uint)(iVar189 < (int)fVar151) * iVar189 |
                   (uint)(iVar189 >= (int)fVar151) * (int)fVar151;
          auVar147._0_4_ =
               -(uint)((int)(((int)uVar86 < (int)uVar50) * uVar86 |
                            ((int)uVar86 >= (int)uVar50) * uVar50) < dist.field_0.i[0]);
          auVar147._4_4_ =
               -(uint)((int)(((int)uVar105 < (int)uVar72) * uVar105 |
                            ((int)uVar105 >= (int)uVar72) * uVar72) < dist.field_0.i[1]);
          auVar147._8_4_ =
               -(uint)((int)(((int)uVar110 < (int)uVar76) * uVar110 |
                            ((int)uVar110 >= (int)uVar76) * uVar76) < dist.field_0.i[2]);
          auVar147._12_4_ =
               -(uint)((int)(((int)uVar112 < (int)uVar80) * uVar112 |
                            ((int)uVar112 >= (int)uVar80) * uVar80) < dist.field_0.i[3]);
          uVar35 = movmskps((int)lVar37,auVar147);
          bVar38 = ~(byte)uVar35 & (byte)uVar27;
          if (bVar38 != 0) {
            uVar36 = (ulong)bVar38;
            do {
              lVar37 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
              fVar81 = *(float *)(ray + k * 4 + 0x80);
              if (*(float *)((long)&stack[-1].ptr.ptr + lVar37 * 4) <= fVar81) {
                local_1168 = ZEXT416((uint)fVar81);
                uVar6 = *(ushort *)(local_10f0 + lVar37 * 8);
                uVar7 = *(ushort *)(local_10f0 + 2 + lVar37 * 8);
                uVar50 = *(uint *)(local_10f0 + 0x50);
                uVar34 = CONCAT44(0,uVar50);
                uVar72 = *(uint *)(local_10f0 + 4 + lVar37 * 8);
                local_1300 = (Scene *)(ulong)uVar72;
                pSVar8 = context->scene;
                pGVar9 = (pSVar8->geometries).items[uVar34].ptr;
                lVar37 = *(long *)&pGVar9->field_0x58;
                lVar48 = *(long *)&pGVar9[1].time_range.upper;
                local_1308 = (long)local_1300 *
                             pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i;
                uVar80 = uVar6 & 0x7fff;
                uVar86 = uVar7 & 0x7fff;
                uVar76 = *(uint *)(lVar37 + 4 + local_1308);
                uVar32 = (ulong)uVar76;
                uVar44 = (ulong)(uVar76 * uVar86 + *(int *)(lVar37 + local_1308) + uVar80);
                p_Var10 = pGVar9[1].intersectionFilterN;
                pfVar2 = (float *)(lVar48 + (long)p_Var10 * uVar44);
                fVar166 = *pfVar2;
                local_fb8 = pfVar2[1];
                fVar160 = pfVar2[2];
                pfVar2 = (float *)(lVar48 + (uVar44 + 1) * (long)p_Var10);
                local_1148 = *pfVar2;
                local_f98 = pfVar2[1];
                fVar52 = pfVar2[2];
                pfVar2 = (float *)(lVar48 + (uVar44 + uVar32) * (long)p_Var10);
                fVar123 = *pfVar2;
                fVar113 = pfVar2[1];
                local_12f8 = pfVar2[2];
                lVar40 = uVar44 + uVar32 + 1;
                pfVar2 = (float *)(lVar48 + lVar40 * (long)p_Var10);
                fVar151 = *pfVar2;
                fVar49 = pfVar2[1];
                fVar71 = pfVar2[2];
                uVar42 = (ulong)(-1 < (short)uVar6);
                pfVar2 = (float *)(lVar48 + (uVar44 + uVar42 + 1) * (long)p_Var10);
                fVar74 = pfVar2[2];
                lVar47 = uVar42 + lVar40;
                pfVar1 = (float *)(lVar48 + lVar47 * (long)p_Var10);
                fVar75 = *pfVar1;
                fVar79 = pfVar1[1];
                fVar85 = pfVar1[2];
                uVar42 = 0;
                if (-1 < (short)uVar7) {
                  uVar42 = uVar32;
                }
                pfVar1 = (float *)(lVar48 + (uVar44 + uVar32 + uVar42) * (long)p_Var10);
                fVar109 = *pfVar1;
                fVar83 = pfVar1[1];
                fStack_12ec = pfVar1[2];
                pfVar1 = (float *)(lVar48 + (lVar40 + uVar42) * (long)p_Var10);
                fVar111 = *pfVar1;
                fVar124 = pfVar1[1];
                fStack_12f0 = pfVar1[2];
                fVar134 = *(float *)(lVar48 + (uVar42 + lVar47) * (long)p_Var10 + 4);
                fStack_f94 = pfVar2[1];
                fStack_f90 = fVar79;
                fStack_f8c = fVar49;
                fVar87 = local_fb8 - local_f98;
                fVar106 = local_f98 - pfVar2[1];
                fVar137 = fVar49 - fVar79;
                fVar140 = fVar113 - fVar49;
                fVar152 = fVar160 - fVar52;
                fVar157 = fVar52 - fVar74;
                fVar158 = fVar71 - fVar85;
                fVar159 = local_12f8 - fVar71;
                fVar199 = fVar113 - local_fb8;
                fVar200 = fVar49 - local_f98;
                fVar201 = fVar124 - fVar49;
                fVar202 = fVar83 - fVar113;
                fVar203 = local_12f8 - fVar160;
                fVar204 = fVar71 - fVar52;
                fVar205 = fStack_12f0 - fVar71;
                fVar206 = fStack_12ec - local_12f8;
                local_11a8[0] = fVar152 * fVar199 - fVar87 * fVar203;
                local_11a8[1] = fVar157 * fVar200 - fVar106 * fVar204;
                local_11a8[2] = fVar158 * fVar201 - fVar137 * fVar205;
                local_11a8[3] = fVar159 * fVar202 - fVar140 * fVar206;
                fVar175 = fVar123 - fVar166;
                fVar177 = fVar151 - local_1148;
                fVar179 = fVar111 - fVar151;
                fVar181 = fVar109 - fVar123;
                fVar104 = *(float *)(ray + k * 4);
                fVar78 = *(float *)(ray + k * 4 + 0x10);
                fStack_125c = *(float *)(ray + k * 4 + 0x40);
                local_1348._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
                local_fa8 = fVar166 - fVar104;
                fStack_fa4 = local_1148 - fVar104;
                fStack_fa0 = fVar151 - fVar104;
                fStack_f9c = fVar123 - fVar104;
                local_fb8 = local_fb8 - fVar78;
                fStack_fb4 = local_f98 - fVar78;
                fStack_fb0 = fVar49 - fVar78;
                fStack_fac = fVar113 - fVar78;
                fVar182 = local_fa8 * (float)local_1348._4_4_ - local_fb8 * fStack_125c;
                fVar184 = fStack_fa4 * (float)local_1348._4_4_ - fStack_fb4 * fStack_125c;
                fVar186 = fStack_fa0 * (float)local_1348._4_4_ - fStack_fb0 * fStack_125c;
                fVar188 = fStack_f9c * (float)local_1348._4_4_ - fStack_fac * fStack_125c;
                fStack_1144 = *pfVar2;
                local_1138 = (StackItemT<embree::NodeRefPtr<4>_> *)CONCAT44(fVar151,fVar75);
                fVar166 = fVar166 - local_1148;
                fVar169 = local_1148 - *pfVar2;
                fVar170 = fVar151 - fVar75;
                fVar171 = fVar123 - fVar151;
                local_1198._0_4_ = fVar166 * fVar203 - fVar152 * fVar175;
                local_1198._4_4_ = fVar169 * fVar204 - fVar157 * fVar177;
                local_1198._8_4_ = fVar170 * fVar205 - fVar158 * fVar179;
                local_1198._12_4_ = fVar171 * fVar206 - fVar159 * fVar181;
                local_10a8 = *(float *)(ray + k * 4 + 0x20);
                fStack_12b4 = *(float *)(ray + k * 4 + 0x60);
                fStack_10a4 = local_10a8;
                fStack_10a0 = local_10a8;
                fStack_109c = local_10a8;
                fVar160 = fVar160 - local_10a8;
                fVar163 = fVar52 - local_10a8;
                fVar164 = fVar71 - local_10a8;
                fVar165 = local_12f8 - local_10a8;
                fVar51 = fVar160 * fStack_125c - local_fa8 * fStack_12b4;
                fVar73 = fVar163 * fStack_125c - fStack_fa4 * fStack_12b4;
                fVar77 = fVar164 * fStack_125c - fStack_fa0 * fStack_12b4;
                fVar82 = fVar165 * fStack_125c - fStack_f9c * fStack_12b4;
                fVar126 = fVar87 * fVar175 - fVar166 * fVar199;
                fVar136 = fVar106 * fVar177 - fVar169 * fVar200;
                fVar139 = fVar137 * fVar179 - fVar170 * fVar201;
                fVar142 = fVar140 * fVar181 - fVar171 * fVar202;
                fVar195 = local_fb8 * fStack_12b4 - fVar160 * (float)local_1348._4_4_;
                fVar196 = fStack_fb4 * fStack_12b4 - fVar163 * (float)local_1348._4_4_;
                fVar197 = fStack_fb0 * fStack_12b4 - fVar164 * (float)local_1348._4_4_;
                fVar198 = fStack_fac * fStack_12b4 - fVar165 * (float)local_1348._4_4_;
                local_12b8 = fStack_12b4;
                fStack_12b0 = fStack_12b4;
                fStack_12ac = fStack_12b4;
                local_1348._0_4_ = local_1348._4_4_;
                fStack_1340 = (float)local_1348._4_4_;
                fStack_133c = (float)local_1348._4_4_;
                fVar190 = local_11a8[0] * fStack_125c +
                          (float)local_1198._0_4_ * (float)local_1348._4_4_ + fVar126 * fStack_12b4;
                fVar191 = local_11a8[1] * fStack_125c +
                          (float)local_1198._4_4_ * (float)local_1348._4_4_ + fVar136 * fStack_12b4;
                fVar192 = local_11a8[2] * fStack_125c +
                          (float)local_1198._8_4_ * (float)local_1348._4_4_ + fVar139 * fStack_12b4;
                fVar193 = local_11a8[3] * fStack_125c +
                          (float)local_1198._12_4_ * (float)local_1348._4_4_ + fVar142 * fStack_12b4
                ;
                uVar105 = (uint)fVar190 & 0x80000000;
                uVar110 = (uint)fVar191 & 0x80000000;
                uVar112 = (uint)fVar192 & 0x80000000;
                uVar125 = (uint)fVar193 & 0x80000000;
                fVar175 = (float)((uint)(fVar175 * fVar195 + fVar199 * fVar51 + fVar203 * fVar182) ^
                                 uVar105);
                fVar177 = (float)((uint)(fVar177 * fVar196 + fVar200 * fVar73 + fVar204 * fVar184) ^
                                 uVar110);
                fVar179 = (float)((uint)(fVar179 * fVar197 + fVar201 * fVar77 + fVar205 * fVar186) ^
                                 uVar112);
                fVar181 = (float)((uint)(fVar181 * fVar198 + fVar202 * fVar82 + fVar206 * fVar188) ^
                                 uVar125);
                fVar51 = (float)((uint)(fVar195 * fVar166 + fVar51 * fVar87 + fVar182 * fVar152) ^
                                uVar105);
                fVar73 = (float)((uint)(fVar196 * fVar169 + fVar73 * fVar106 + fVar184 * fVar157) ^
                                uVar110);
                fVar77 = (float)((uint)(fVar197 * fVar170 + fVar77 * fVar137 + fVar186 * fVar158) ^
                                uVar112);
                fVar82 = (float)((uint)(fVar198 * fVar171 + fVar82 * fVar140 + fVar188 * fVar159) ^
                                uVar125);
                fVar87 = ABS(fVar190);
                fVar106 = ABS(fVar191);
                fVar137 = ABS(fVar192);
                fVar140 = ABS(fVar193);
                bVar23 = fVar175 + fVar51 <= fVar87 &&
                         ((0.0 <= fVar175 && 0.0 <= fVar51) && fVar190 != 0.0);
                bVar24 = fVar177 + fVar73 <= fVar106 &&
                         ((0.0 <= fVar177 && 0.0 <= fVar73) && fVar191 != 0.0);
                bVar22 = ((0.0 <= fVar179 && 0.0 <= fVar77) && fVar192 != 0.0) &&
                         fVar179 + fVar77 <= fVar137;
                bVar21 = ((0.0 <= fVar181 && 0.0 <= fVar82) && fVar193 != 0.0) &&
                         fVar181 + fVar82 <= fVar140;
                auVar18._4_4_ = -(uint)bVar24;
                auVar18._0_4_ = -(uint)bVar23;
                auVar18._8_4_ = -(uint)bVar22;
                auVar18._12_4_ = -(uint)bVar21;
                iVar28 = movmskps(uVar76,auVar18);
                local_10d8 = ZEXT416(uVar50);
                local_10e8 = ZEXT416(uVar72);
                local_1158 = ZEXT416(uVar80);
                local_ff8 = ZEXT416(uVar86);
                auVar119._4_12_ = local_1198._4_12_;
                fVar166 = fVar71;
                if (iVar28 == 0) {
                  auVar156._4_4_ = fVar78;
                  auVar156._0_4_ = fVar78;
                  auVar156._8_4_ = fVar78;
                  auVar156._12_4_ = fVar78;
                  uVar76 = 0;
                }
                else {
                  fVar152 = (float)(uVar105 ^
                                   (uint)(local_fa8 * local_11a8[0] +
                                         local_fb8 * (float)local_1198._0_4_ + fVar160 * fVar126));
                  fVar157 = (float)(uVar110 ^
                                   (uint)(fStack_fa4 * local_11a8[1] +
                                         fStack_fb4 * (float)local_1198._4_4_ + fVar163 * fVar136));
                  fVar158 = (float)(uVar112 ^
                                   (uint)(fStack_fa0 * local_11a8[2] +
                                         fStack_fb0 * (float)local_1198._8_4_ + fVar164 * fVar139));
                  fVar159 = (float)(uVar125 ^
                                   (uint)(fStack_f9c * local_11a8[3] +
                                         fStack_fac * (float)local_1198._12_4_ + fVar165 * fVar142))
                  ;
                  fVar160 = *(float *)(ray + k * 4 + 0x30);
                  valid.field_0.i[0] =
                       -(uint)((fVar152 <= fVar81 * fVar87 && fVar160 * fVar87 < fVar152) && bVar23)
                  ;
                  valid.field_0.i[1] =
                       -(uint)((fVar157 <= fVar81 * fVar106 && fVar160 * fVar106 < fVar157) &&
                              bVar24);
                  valid.field_0.i[2] =
                       -(uint)((fVar158 <= fVar81 * fVar137 && fVar160 * fVar137 < fVar158) &&
                              bVar22);
                  valid.field_0.i[3] =
                       -(uint)((fVar159 <= fVar81 * fVar140 && fVar160 * fVar140 < fVar159) &&
                              bVar21);
                  iVar28 = movmskps(iVar28,(undefined1  [16])valid.field_0);
                  auVar156._4_4_ = fVar78;
                  auVar156._0_4_ = fVar78;
                  auVar156._8_4_ = fVar78;
                  auVar156._12_4_ = fVar78;
                  if (iVar28 == 0) {
                    uVar76 = 0;
                  }
                  else {
                    local_1188 = CONCAT44(fVar136,fVar126);
                    uStack_1180 = CONCAT44(fVar142,fVar139);
                    auVar119._0_4_ = (float)(int)(*(ushort *)(lVar37 + 8 + local_1308) - 1);
                    auVar149._4_4_ = local_1198._4_4_;
                    auVar149._0_4_ = auVar119._0_4_;
                    auVar149._8_4_ = local_1198._8_4_;
                    auVar149._12_4_ = local_1198._12_4_;
                    auVar173 = rcpss(auVar149,auVar119);
                    auVar120._0_4_ = (float)(int)(*(ushort *)(lVar37 + 10 + local_1308) - 1);
                    auVar120._4_12_ = auVar119._4_12_;
                    fVar81 = (2.0 - auVar119._0_4_ * auVar173._0_4_) * auVar173._0_4_;
                    auVar162._4_4_ = local_1198._4_4_;
                    auVar162._0_4_ = auVar120._0_4_;
                    auVar162._8_4_ = local_1198._8_4_;
                    auVar162._12_4_ = local_1198._12_4_;
                    auVar173 = rcpss(auVar162,auVar120);
                    fVar160 = (2.0 - auVar120._0_4_ * auVar173._0_4_) * auVar173._0_4_;
                    tNear.field_0.v[0] = fVar81 * ((float)uVar80 * fVar87 + fVar175);
                    tNear.field_0.v[1] = fVar81 * ((float)(uVar80 + 1) * fVar106 + fVar177);
                    tNear.field_0.v[2] = fVar81 * ((float)(uVar80 + 1) * fVar137 + fVar179);
                    tNear.field_0.v[3] = fVar81 * ((float)uVar80 * fVar140 + fVar181);
                    auVar121._0_4_ = (float)uVar86 * fVar87 + fVar51;
                    auVar121._4_4_ = (float)uVar86 * fVar106 + fVar73;
                    auVar121._8_4_ = (float)(uVar86 + 1) * fVar137 + fVar77;
                    auVar121._12_4_ = (float)(uVar86 + 1) * fVar140 + fVar82;
                    pGVar9 = (pSVar8->geometries).items[uVar34].ptr;
                    uVar76 = *(uint *)(ray + k * 4 + 0x90);
                    if ((pGVar9->mask & uVar76) != 0) {
                      auVar19._4_4_ = fVar106;
                      auVar19._0_4_ = fVar87;
                      auVar19._8_4_ = fVar137;
                      auVar19._12_4_ = fVar140;
                      auVar173 = rcpps(auVar121,auVar19);
                      fVar81 = auVar173._0_4_;
                      fVar78 = auVar173._4_4_;
                      fVar51 = auVar173._8_4_;
                      fVar73 = auVar173._12_4_;
                      fVar81 = (1.0 - fVar87 * fVar81) * fVar81 + fVar81;
                      fVar78 = (1.0 - fVar106 * fVar78) * fVar78 + fVar78;
                      fVar51 = (1.0 - fVar137 * fVar51) * fVar51 + fVar51;
                      fVar73 = (1.0 - fVar140 * fVar73) * fVar73 + fVar73;
                      auVar168._0_4_ = fVar152 * fVar81;
                      auVar168._4_4_ = fVar157 * fVar78;
                      auVar168._8_4_ = fVar158 * fVar51;
                      auVar168._12_4_ = fVar159 * fVar73;
                      local_11b8 = auVar168;
                      local_11d8[0] = tNear.field_0.v[0] * fVar81;
                      local_11d8[1] = tNear.field_0.v[1] * fVar78;
                      local_11d8[2] = tNear.field_0.v[2] * fVar51;
                      local_11d8[3] = tNear.field_0.v[3] * fVar73;
                      local_11c8[0] = fVar160 * auVar121._0_4_ * fVar81;
                      local_11c8[1] = fVar160 * auVar121._4_4_ * fVar78;
                      local_11c8[2] = fVar160 * auVar121._8_4_ * fVar51;
                      local_11c8[3] = fVar160 * auVar121._12_4_ * fVar73;
                      auVar173 = blendvps(_DAT_01f7a9f0,auVar168,(undefined1  [16])valid.field_0);
                      auVar150._4_4_ = auVar173._0_4_;
                      auVar150._0_4_ = auVar173._4_4_;
                      auVar150._8_4_ = auVar173._12_4_;
                      auVar150._12_4_ = auVar173._8_4_;
                      auVar60 = minps(auVar150,auVar173);
                      auVar131._0_8_ = auVar60._8_8_;
                      auVar131._8_4_ = auVar60._0_4_;
                      auVar131._12_4_ = auVar60._4_4_;
                      auVar60 = minps(auVar131,auVar60);
                      uVar110 = -(uint)(auVar60._0_4_ == auVar173._0_4_);
                      uVar112 = -(uint)(auVar60._4_4_ == auVar173._4_4_);
                      uVar125 = -(uint)(auVar60._8_4_ == auVar173._8_4_);
                      uVar135 = -(uint)(auVar60._12_4_ == auVar173._12_4_);
                      auVar122._0_4_ = uVar110 & valid.field_0.i[0];
                      auVar122._4_4_ = uVar112 & valid.field_0.i[1];
                      auVar122._8_4_ = uVar125 & valid.field_0.i[2];
                      auVar122._12_4_ = uVar135 & valid.field_0.i[3];
                      iVar28 = movmskps(uVar76,auVar122);
                      uVar76 = 0xffffffff;
                      uVar80 = 0xffffffff;
                      uVar86 = 0xffffffff;
                      uVar105 = 0xffffffff;
                      if (iVar28 != 0) {
                        uVar76 = uVar110;
                        uVar80 = uVar112;
                        uVar86 = uVar125;
                        uVar105 = uVar135;
                      }
                      auVar66._0_4_ = valid.field_0.i[0] & uVar76;
                      auVar66._4_4_ = valid.field_0.i[1] & uVar80;
                      auVar66._8_4_ = valid.field_0.i[2] & uVar86;
                      auVar66._12_4_ = valid.field_0.i[3] & uVar105;
                      uVar76 = movmskps(iVar28,auVar66);
                      lVar48 = 0;
                      if (uVar76 != 0) {
                        for (; (uVar76 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                        }
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        fVar81 = local_11d8[lVar48];
                        fVar160 = local_11c8[lVar48];
                        fVar78 = local_11a8[lVar48];
                        uVar27 = *(undefined4 *)(local_1198 + lVar48 * 4);
                        uVar35 = *(undefined4 *)((long)&local_1188 + lVar48 * 4);
                        *(float *)(ray + k * 4 + 0x80) = local_11a8[lVar48 + -4];
                        *(float *)(ray + k * 4 + 0xc0) = fVar78;
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar27;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar35;
                        *(float *)(ray + k * 4 + 0xf0) = fVar81;
                        *(float *)(ray + k * 4 + 0x100) = fVar160;
                        *(uint *)(ray + k * 4 + 0x110) = uVar72;
                        *(uint *)(ray + k * 4 + 0x120) = uVar50;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        uVar76 = context->user->instPrimID[0];
                        *(uint *)(ray + k * 4 + 0x140) = uVar76;
                      }
                      else {
                        local_1168._8_8_ = 0;
                        local_1168._0_8_ = uVar34;
                        auVar25 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar31);
                        uStack_127c = (undefined4)
                                      ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar31 + 8) >> 0x20
                                      );
                        _local_1348 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                        fStack_12f4 = fVar71;
                        while( true ) {
                          local_1068 = local_11d8[lVar48];
                          local_1058._4_4_ = local_11c8[lVar48];
                          *(float *)(ray + k * 4 + 0x80) = local_11a8[lVar48 + -4];
                          args.context = context->user;
                          local_1098 = local_11a8[lVar48];
                          local_1088._4_4_ = *(undefined4 *)(local_1198 + lVar48 * 4);
                          local_1078._4_4_ = *(undefined4 *)((long)&local_1188 + lVar48 * 4);
                          fStack_1094 = local_1098;
                          fStack_1090 = local_1098;
                          fStack_108c = local_1098;
                          local_1088._0_4_ = local_1088._4_4_;
                          local_1088._8_4_ = local_1088._4_4_;
                          local_1088._12_4_ = local_1088._4_4_;
                          local_1078._0_4_ = local_1078._4_4_;
                          local_1078._8_4_ = local_1078._4_4_;
                          local_1078._12_4_ = local_1078._4_4_;
                          fStack_1064 = local_1068;
                          fStack_1060 = local_1068;
                          fStack_105c = local_1068;
                          local_1058._0_4_ = local_1058._4_4_;
                          fStack_1050 = (float)local_1058._4_4_;
                          fStack_104c = (float)local_1058._4_4_;
                          local_1048 = CONCAT44(uVar72,uVar72);
                          uStack_1040 = CONCAT44(uVar72,uVar72);
                          local_1038 = CONCAT44(uVar50,uVar50);
                          uStack_1030 = CONCAT44(uVar50,uVar50);
                          local_1028 = (args.context)->instID[0];
                          uStack_1024 = local_1028;
                          uStack_1020 = local_1028;
                          uStack_101c = local_1028;
                          local_1018 = (args.context)->instPrimID[0];
                          uStack_1014 = local_1018;
                          uStack_1010 = local_1018;
                          uStack_100c = local_1018;
                          local_1318._12_4_ = uStack_127c;
                          local_1318._0_12_ = auVar25;
                          args.valid = (int *)local_1318;
                          args.geometryUserPtr = pGVar9->userPtr;
                          args.hit = (RTCHitN *)&local_1098;
                          args.N = 4;
                          pRVar33 = (RTCRayN *)pGVar9->intersectionFilterN;
                          args.ray = (RTCRayN *)ray;
                          if (pRVar33 != (RTCRayN *)0x0) {
                            pRVar33 = (RTCRayN *)(*(code *)pRVar33)(&args);
                          }
                          if (local_1318 == (undefined1  [16])0x0) {
                            auVar97._8_4_ = 0xffffffff;
                            auVar97._0_8_ = 0xffffffffffffffff;
                            auVar97._12_4_ = 0xffffffff;
                            auVar97 = auVar97 ^ _DAT_01f7ae20;
                          }
                          else {
                            pRVar33 = (RTCRayN *)context->args->filter;
                            if ((pRVar33 != (RTCRayN *)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                              pRVar33 = (RTCRayN *)(*(code *)pRVar33)(&args);
                            }
                            auVar69._0_4_ = -(uint)(local_1318._0_4_ == 0);
                            auVar69._4_4_ = -(uint)(local_1318._4_4_ == 0);
                            auVar69._8_4_ = -(uint)(local_1318._8_4_ == 0);
                            auVar69._12_4_ = -(uint)(local_1318._12_4_ == 0);
                            auVar97 = auVar69 ^ _DAT_01f7ae20;
                            if (local_1318 != (undefined1  [16])0x0) {
                              auVar173 = blendvps(*(undefined1 (*) [16])args.hit,
                                                  *(undefined1 (*) [16])(args.ray + 0xc0),auVar69);
                              *(undefined1 (*) [16])(args.ray + 0xc0) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                                  *(undefined1 (*) [16])(args.ray + 0xd0),auVar69);
                              *(undefined1 (*) [16])(args.ray + 0xd0) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                                  *(undefined1 (*) [16])(args.ray + 0xe0),auVar69);
                              *(undefined1 (*) [16])(args.ray + 0xe0) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                                  *(undefined1 (*) [16])(args.ray + 0xf0),auVar69);
                              *(undefined1 (*) [16])(args.ray + 0xf0) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                                  *(undefined1 (*) [16])(args.ray + 0x100),auVar69);
                              *(undefined1 (*) [16])(args.ray + 0x100) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                                  *(undefined1 (*) [16])(args.ray + 0x110),auVar69);
                              *(undefined1 (*) [16])(args.ray + 0x110) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                                  *(undefined1 (*) [16])(args.ray + 0x120),auVar69);
                              *(undefined1 (*) [16])(args.ray + 0x120) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                                  *(undefined1 (*) [16])(args.ray + 0x130),auVar69);
                              *(undefined1 (*) [16])(args.ray + 0x130) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                                  *(undefined1 (*) [16])(args.ray + 0x140),auVar69);
                              *(undefined1 (*) [16])(args.ray + 0x140) = auVar173;
                              pRVar33 = args.ray;
                            }
                          }
                          if ((_DAT_01f7bb20 & auVar97) == (undefined1  [16])0x0) {
                            *(undefined4 *)(ray + k * 4 + 0x80) = local_1348._0_4_;
                          }
                          else {
                            local_1348._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                            local_1348._4_4_ = 0;
                            fStack_1340 = 0.0;
                            fStack_133c = 0.0;
                          }
                          *(undefined4 *)(local_1318 + lVar48 * 4 + -0x10) = 0;
                          valid.field_0.i[0] =
                               -(uint)(auVar168._0_4_ <= (float)local_1348._0_4_) &
                               valid.field_0.i[0];
                          valid.field_0.i[1] =
                               -(uint)(auVar168._4_4_ <= (float)local_1348._0_4_) &
                               valid.field_0.i[1];
                          valid.field_0.i[2] =
                               -(uint)(auVar168._8_4_ <= (float)local_1348._0_4_) &
                               valid.field_0.i[2];
                          valid.field_0.i[3] =
                               -(uint)(auVar168._12_4_ <= (float)local_1348._0_4_) &
                               valid.field_0.i[3];
                          iVar28 = movmskps((int)pRVar33,(undefined1  [16])valid.field_0);
                          if (iVar28 == 0) break;
                          auVar60 = blendvps(_DAT_01f7a9f0,auVar168,(undefined1  [16])valid.field_0)
                          ;
                          auVar133._4_4_ = auVar60._0_4_;
                          auVar133._0_4_ = auVar60._4_4_;
                          auVar133._8_4_ = auVar60._12_4_;
                          auVar133._12_4_ = auVar60._8_4_;
                          auVar173 = minps(auVar133,auVar60);
                          auVar98._0_8_ = auVar173._8_8_;
                          auVar98._8_4_ = auVar173._0_4_;
                          auVar98._12_4_ = auVar173._4_4_;
                          auVar173 = minps(auVar98,auVar173);
                          auVar99._0_8_ =
                               CONCAT44(-(uint)(auVar173._4_4_ == auVar60._4_4_) &
                                        valid.field_0.i[1],
                                        -(uint)(auVar173._0_4_ == auVar60._0_4_) &
                                        valid.field_0.i[0]);
                          auVar99._8_4_ =
                               -(uint)(auVar173._8_4_ == auVar60._8_4_) & valid.field_0.i[2];
                          auVar99._12_4_ =
                               -(uint)(auVar173._12_4_ == auVar60._12_4_) & valid.field_0.i[3];
                          iVar28 = movmskps(iVar28,auVar99);
                          aVar70 = valid.field_0;
                          if (iVar28 != 0) {
                            aVar70.i[2] = auVar99._8_4_;
                            aVar70._0_8_ = auVar99._0_8_;
                            aVar70.i[3] = auVar99._12_4_;
                          }
                          uVar27 = movmskps(iVar28,(undefined1  [16])aVar70);
                          uVar34 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar27);
                          lVar48 = 0;
                          if (uVar34 != 0) {
                            for (; (uVar34 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                            }
                          }
                        }
                        fVar104 = *(float *)(ray + k * 4);
                        uVar27 = *(undefined4 *)(ray + k * 4 + 0x10);
                        local_10a8 = *(float *)(ray + k * 4 + 0x20);
                        fStack_125c = *(float *)(ray + k * 4 + 0x40);
                        auVar156._4_4_ = uVar27;
                        auVar156._0_4_ = uVar27;
                        auVar156._8_4_ = uVar27;
                        auVar156._12_4_ = uVar27;
                        fStack_10a4 = local_10a8;
                        fStack_10a0 = local_10a8;
                        fStack_109c = local_10a8;
                        local_1348._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
                        local_1348._0_4_ = local_1348._4_4_;
                        fStack_1340 = (float)local_1348._4_4_;
                        fStack_133c = (float)local_1348._4_4_;
                        fStack_12b4 = *(float *)(ray + k * 4 + 0x60);
                        local_12b8 = fStack_12b4;
                        fStack_12b0 = fStack_12b4;
                        fStack_12ac = fStack_12b4;
                        uVar72 = (uint)local_1300;
                        uVar76 = 0;
                        uVar34 = local_1168._0_8_;
                        fVar166 = fStack_12f4;
                        pSVar8 = local_1300;
                      }
                    }
                  }
                }
                local_1300 = pSVar8;
                fVar123 = fVar151 - fVar123;
                fStack_12f4 = fVar75 - fVar151;
                fVar111 = fStack_13a0 - fVar111;
                fVar109 = fStack_139c - fVar109;
                fVar113 = fVar49 - fVar113;
                fVar81 = fVar79 - fVar49;
                fVar160 = fVar134 - fVar124;
                fVar83 = fVar124 - fVar83;
                local_12f8 = fVar71 - local_12f8;
                fVar166 = fVar85 - fVar166;
                fStack_12f0 = fStack_1380 - fStack_12f0;
                fStack_12ec = fStack_137c - fStack_12ec;
                local_1148 = local_1148 - fVar151;
                fStack_1144 = fStack_1144 - fVar75;
                fVar182 = fStack_1140 - fStack_13a0;
                fVar184 = fStack_113c - fStack_139c;
                fVar165 = local_f98 - fVar49;
                fVar169 = fStack_f94 - fVar79;
                fVar170 = fStack_f90 - fVar134;
                fVar171 = fStack_f8c - fVar124;
                fVar52 = fVar52 - fVar71;
                fVar74 = fVar74 - fVar85;
                fVar78 = fVar85 - fStack_1380;
                fVar51 = fVar71 - fStack_137c;
                local_11a8[0] = fVar165 * local_12f8 - fVar52 * fVar113;
                local_11a8[1] = fVar169 * fVar166 - fVar74 * fVar81;
                local_11a8[2] = fVar170 * fStack_12f0 - fVar78 * fVar160;
                local_11a8[3] = fVar171 * fStack_12ec - fVar51 * fVar83;
                local_1198._0_4_ = fVar52 * fVar123 - local_1148 * local_12f8;
                local_1198._4_4_ = fVar74 * fStack_12f4 - fStack_1144 * fVar166;
                local_1198._8_4_ = fVar78 * fVar111 - fVar182 * fStack_12f0;
                local_1198._12_4_ = fVar51 * fVar109 - fVar184 * fStack_12ec;
                fVar175 = local_1148 * fVar113 - fVar165 * fVar123;
                fVar177 = fStack_1144 * fVar81 - fVar169 * fStack_12f4;
                fVar179 = fVar182 * fVar160 - fVar170 * fVar111;
                fVar181 = fVar184 * fVar83 - fVar171 * fVar109;
                fVar151 = fVar151 - fVar104;
                fVar75 = fVar75 - fVar104;
                fVar159 = fStack_13a0 - fVar104;
                fVar104 = fStack_139c - fVar104;
                fVar49 = fVar49 - auVar156._0_4_;
                fVar79 = fVar79 - auVar156._4_4_;
                fVar134 = fVar134 - auVar156._8_4_;
                fVar124 = fVar124 - auVar156._12_4_;
                fVar71 = fVar71 - fStack_109c;
                fVar85 = fVar85 - fStack_109c;
                fStack_1380 = fStack_1380 - fStack_109c;
                fStack_137c = fStack_137c - fStack_109c;
                fVar106 = fVar49 * local_12b8 - fVar71 * (float)local_1348._0_4_;
                fVar137 = fVar79 * fStack_12b4 - fVar85 * (float)local_1348._4_4_;
                fVar140 = fVar134 * fStack_12b0 - fStack_1380 * fStack_1340;
                fVar126 = fVar124 * fStack_12ac - fStack_137c * fStack_133c;
                fVar136 = fVar71 * fStack_125c - fVar151 * local_12b8;
                fVar139 = fVar85 * fStack_125c - fVar75 * fStack_12b4;
                fVar142 = fStack_1380 * fStack_125c - fVar159 * fStack_12b0;
                fVar152 = fStack_137c * fStack_125c - fVar104 * fStack_12ac;
                fVar157 = fVar151 * (float)local_1348._0_4_ - fVar49 * fStack_125c;
                fVar158 = fVar75 * (float)local_1348._4_4_ - fVar79 * fStack_125c;
                fVar163 = fVar159 * fStack_1340 - fVar134 * fStack_125c;
                fVar164 = fVar104 * fStack_133c - fVar124 * fStack_125c;
                local_13a8 = CONCAT44(fVar177,fVar175);
                fVar73 = fStack_125c * local_11a8[0] +
                         (float)local_1348._0_4_ * (float)local_1198._0_4_ + local_12b8 * fVar175;
                fVar77 = fStack_125c * local_11a8[1] +
                         (float)local_1348._4_4_ * (float)local_1198._4_4_ + fStack_12b4 * fVar177;
                fVar82 = fStack_125c * local_11a8[2] +
                         fStack_1340 * (float)local_1198._8_4_ + fStack_12b0 * fVar179;
                fVar87 = fStack_125c * local_11a8[3] +
                         fStack_133c * (float)local_1198._12_4_ + fStack_12ac * fVar181;
                uVar50 = (uint)fVar73 & 0x80000000;
                uVar80 = (uint)fVar77 & 0x80000000;
                uVar86 = (uint)fVar82 & 0x80000000;
                uVar105 = (uint)fVar87 & 0x80000000;
                fVar165 = (float)((uint)(local_1148 * fVar106 + fVar165 * fVar136 + fVar52 * fVar157
                                        ) ^ uVar50);
                fVar169 = (float)((uint)(fStack_1144 * fVar137 +
                                        fVar169 * fVar139 + fVar74 * fVar158) ^ uVar80);
                fVar170 = (float)((uint)(fVar182 * fVar140 + fVar170 * fVar142 + fVar78 * fVar163) ^
                                 uVar86);
                fVar171 = (float)((uint)(fVar184 * fVar126 + fVar171 * fVar152 + fVar51 * fVar164) ^
                                 uVar105);
                auVar128._0_4_ =
                     (float)((uint)(fVar106 * fVar123 + fVar136 * fVar113 + fVar157 * local_12f8) ^
                            uVar50);
                auVar128._4_4_ =
                     (float)((uint)(fVar137 * fStack_12f4 + fVar139 * fVar81 + fVar158 * fVar166) ^
                            uVar80);
                auVar128._8_4_ =
                     (float)((uint)(fVar140 * fVar111 + fVar142 * fVar160 + fVar163 * fStack_12f0) ^
                            uVar86);
                auVar128._12_4_ =
                     (float)((uint)(fVar126 * fVar109 + fVar152 * fVar83 + fVar164 * fStack_12ec) ^
                            uVar105);
                fVar81 = ABS(fVar73);
                fVar113 = ABS(fVar77);
                auVar161._0_8_ = CONCAT44(fVar77,fVar73) & 0x7fffffff7fffffff;
                auVar161._8_4_ = ABS(fVar82);
                auVar161._12_4_ = ABS(fVar87);
                bVar23 = fVar165 + auVar128._0_4_ <= fVar81 &&
                         ((0.0 <= auVar128._0_4_ && 0.0 <= fVar165) && fVar73 != 0.0);
                auVar92._0_4_ = -(uint)bVar23;
                bVar24 = fVar169 + auVar128._4_4_ <= fVar113 &&
                         ((0.0 <= auVar128._4_4_ && 0.0 <= fVar169) && fVar77 != 0.0);
                auVar92._4_4_ = -(uint)bVar24;
                bVar22 = fVar170 + auVar128._8_4_ <= auVar161._8_4_ &&
                         ((0.0 <= auVar128._8_4_ && 0.0 <= fVar170) && fVar82 != 0.0);
                auVar92._8_4_ = -(uint)bVar22;
                bVar21 = fVar171 + auVar128._12_4_ <= auVar161._12_4_ &&
                         ((0.0 <= auVar128._12_4_ && 0.0 <= fVar171) && fVar87 != 0.0);
                auVar92._12_4_ = -(uint)bVar21;
                iVar29 = movmskps(uVar76,auVar92);
                iVar176 = local_10c8;
                iVar178 = iStack_10c4;
                iVar180 = iStack_10c0;
                iVar28 = iStack_10bc;
                iVar183 = local_10b8;
                iVar185 = iStack_10b4;
                iVar187 = iStack_10b0;
                iVar189 = iStack_10ac;
                fVar74 = local_fd8;
                fVar78 = fStack_fd4;
                fVar83 = fStack_fd0;
                fVar160 = fStack_fcc;
                fVar51 = local_fe8;
                fVar73 = fStack_fe4;
                fVar77 = fStack_fe0;
                fVar52 = fStack_fdc;
                fVar82 = local_fc8;
                fVar87 = fStack_fc4;
                fVar106 = fStack_fc0;
                fVar166 = fStack_fbc;
                fStack_13a0 = fVar179;
                fStack_139c = fVar181;
                if (iVar29 != 0) {
                  fVar71 = (float)(uVar50 ^ (uint)(fVar151 * local_11a8[0] +
                                                  fVar49 * (float)local_1198._0_4_ +
                                                  fVar71 * fVar175));
                  fVar75 = (float)(uVar80 ^ (uint)(fVar75 * local_11a8[1] +
                                                  fVar79 * (float)local_1198._4_4_ +
                                                  fVar85 * fVar177));
                  fVar79 = (float)(uVar86 ^ (uint)(fVar159 * local_11a8[2] +
                                                  fVar134 * (float)local_1198._8_4_ +
                                                  fStack_1380 * fVar179));
                  fVar85 = (float)(uVar105 ^
                                  (uint)(fVar104 * local_11a8[3] +
                                        fVar124 * (float)local_1198._12_4_ + fStack_137c * fVar181))
                  ;
                  fVar151 = *(float *)(ray + k * 4 + 0x30);
                  fVar49 = *(float *)(ray + k * 4 + 0x80);
                  valid.field_0.i[0] =
                       -(uint)((fVar71 <= fVar49 * fVar81 && fVar151 * fVar81 < fVar71) && bVar23);
                  valid.field_0.i[1] =
                       -(uint)((fVar75 <= fVar49 * fVar113 && fVar151 * fVar113 < fVar75) && bVar24)
                  ;
                  valid.field_0.i[2] =
                       -(uint)((fVar79 <= fVar49 * auVar161._8_4_ &&
                               fVar151 * auVar161._8_4_ < fVar79) && bVar22);
                  valid.field_0.i[3] =
                       -(uint)((fVar85 <= fVar49 * auVar161._12_4_ &&
                               fVar151 * auVar161._12_4_ < fVar85) && bVar21);
                  iVar29 = movmskps(iVar29,(undefined1  [16])valid.field_0);
                  if (iVar29 != 0) {
                    local_1188 = local_13a8;
                    uStack_1180 = CONCAT44(fVar181,fVar179);
                    auVar148._0_4_ = fVar81 - auVar128._0_4_;
                    auVar148._4_4_ = fVar113 - auVar128._4_4_;
                    auVar148._8_4_ = auVar161._8_4_ - auVar128._8_4_;
                    auVar148._12_4_ = auVar161._12_4_ - auVar128._12_4_;
                    auVar129._4_12_ = auVar128._4_12_;
                    auVar129._0_4_ = (float)(int)(*(ushort *)(lVar37 + 8 + local_1308) - 1);
                    auVar172._4_4_ = auVar128._4_4_;
                    auVar172._0_4_ = auVar129._0_4_;
                    auVar172._8_4_ = auVar128._8_4_;
                    auVar172._12_4_ = auVar128._12_4_;
                    auVar173 = rcpss(auVar172,auVar129);
                    fVar151 = (2.0 - auVar129._0_4_ * auVar173._0_4_) * auVar173._0_4_;
                    auVar174._4_12_ = auVar173._4_12_;
                    auVar174._0_4_ = (float)(int)(*(ushort *)(lVar37 + 10 + local_1308) - 1);
                    auVar194._4_4_ = auVar173._4_4_;
                    auVar194._0_4_ = auVar174._0_4_;
                    auVar194._8_4_ = auVar173._8_4_;
                    auVar194._12_4_ = auVar173._12_4_;
                    auVar173 = rcpss(auVar194,auVar174);
                    fVar104 = (2.0 - auVar174._0_4_ * auVar173._0_4_) * auVar173._0_4_;
                    tNear.field_0.v[0] =
                         fVar151 * ((float)(int)local_1158._0_4_ * fVar81 + (fVar81 - fVar165));
                    tNear.field_0.v[1] =
                         fVar151 * ((float)(local_1158._0_4_ + 1) * fVar113 + (fVar113 - fVar169));
                    tNear.field_0.v[2] =
                         fVar151 * ((float)(local_1158._0_4_ + 1) * auVar161._8_4_ +
                                   (auVar161._8_4_ - fVar170));
                    tNear.field_0.v[3] =
                         fVar151 * ((float)(int)local_1158._0_4_ * auVar161._12_4_ +
                                   (auVar161._12_4_ - fVar171));
                    pGVar9 = (context->scene->geometries).items[uVar34].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar173 = rcpps(auVar148,auVar161);
                      fVar151 = auVar173._0_4_;
                      fVar124 = auVar173._4_4_;
                      fVar134 = auVar173._8_4_;
                      fVar137 = auVar173._12_4_;
                      fVar151 = (1.0 - fVar81 * fVar151) * fVar151 + fVar151;
                      fVar124 = (1.0 - fVar113 * fVar124) * fVar124 + fVar124;
                      fVar134 = (1.0 - auVar161._8_4_ * fVar134) * fVar134 + fVar134;
                      fVar137 = (1.0 - auVar161._12_4_ * fVar137) * fVar137 + fVar137;
                      auVar167._0_4_ = fVar71 * fVar151;
                      auVar167._4_4_ = fVar75 * fVar124;
                      auVar167._8_4_ = fVar79 * fVar134;
                      auVar167._12_4_ = fVar85 * fVar137;
                      local_11b8 = auVar167;
                      local_11d8[0] = tNear.field_0.v[0] * fVar151;
                      local_11d8[1] = tNear.field_0.v[1] * fVar124;
                      local_11d8[2] = tNear.field_0.v[2] * fVar134;
                      local_11d8[3] = tNear.field_0.v[3] * fVar137;
                      local_11c8[0] =
                           fVar104 * ((float)(int)local_ff8._0_4_ * fVar81 + auVar148._0_4_) *
                           fVar151;
                      local_11c8[1] =
                           fVar104 * ((float)(int)local_ff8._0_4_ * fVar113 + auVar148._4_4_) *
                           fVar124;
                      local_11c8[2] =
                           fVar104 * ((float)(local_ff8._0_4_ + 1) * auVar161._8_4_ + auVar148._8_4_
                                     ) * fVar134;
                      local_11c8[3] =
                           fVar104 * ((float)(local_ff8._0_4_ + 1) * auVar161._12_4_ +
                                     auVar148._12_4_) * fVar137;
                      auVar60 = blendvps(_DAT_01f7a9f0,auVar167,(undefined1  [16])valid.field_0);
                      auVar130._4_4_ = auVar60._0_4_;
                      auVar130._0_4_ = auVar60._4_4_;
                      auVar130._8_4_ = auVar60._12_4_;
                      auVar130._12_4_ = auVar60._8_4_;
                      auVar173 = minps(auVar130,auVar60);
                      auVar93._0_8_ = auVar173._8_8_;
                      auVar93._8_4_ = auVar173._0_4_;
                      auVar93._12_4_ = auVar173._4_4_;
                      auVar173 = minps(auVar93,auVar173);
                      uVar105 = -(uint)(auVar173._0_4_ == auVar60._0_4_);
                      uVar110 = -(uint)(auVar173._4_4_ == auVar60._4_4_);
                      uVar112 = -(uint)(auVar173._8_4_ == auVar60._8_4_);
                      uVar125 = -(uint)(auVar173._12_4_ == auVar60._12_4_);
                      auVar118._0_4_ = uVar105 & valid.field_0.i[0];
                      auVar118._4_4_ = uVar110 & valid.field_0.i[1];
                      auVar118._8_4_ = uVar112 & valid.field_0.i[2];
                      auVar118._12_4_ = uVar125 & valid.field_0.i[3];
                      iVar29 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar118);
                      uVar50 = 0xffffffff;
                      uVar76 = 0xffffffff;
                      uVar80 = 0xffffffff;
                      uVar86 = 0xffffffff;
                      if (iVar29 != 0) {
                        uVar50 = uVar105;
                        uVar76 = uVar110;
                        uVar80 = uVar112;
                        uVar86 = uVar125;
                      }
                      auVar65._0_4_ = valid.field_0.i[0] & uVar50;
                      auVar65._4_4_ = valid.field_0.i[1] & uVar76;
                      auVar65._8_4_ = valid.field_0.i[2] & uVar80;
                      auVar65._12_4_ = valid.field_0.i[3] & uVar86;
                      uVar50 = movmskps(iVar29,auVar65);
                      lVar37 = 0;
                      if (uVar50 != 0) {
                        for (; (uVar50 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                        }
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        fVar81 = local_11d8[lVar37];
                        fVar123 = local_11c8[lVar37];
                        fVar113 = local_11a8[lVar37];
                        uVar27 = *(undefined4 *)(local_1198 + lVar37 * 4);
                        uVar35 = *(undefined4 *)((long)&local_1188 + lVar37 * 4);
                        *(float *)(ray + k * 4 + 0x80) = local_11a8[lVar37 + -4];
                        *(float *)(ray + k * 4 + 0xc0) = fVar113;
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar27;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar35;
                        *(float *)(ray + k * 4 + 0xf0) = fVar81;
                        *(float *)(ray + k * 4 + 0x100) = fVar123;
                        *(uint *)(ray + k * 4 + 0x110) = uVar72;
                        *(int *)(ray + k * 4 + 0x120) = (int)uVar34;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        uVar35 = local_10d8._0_4_;
                        uVar27 = local_10e8._0_4_;
                        local_13a8 = CONCAT44(local_10e8._0_4_,local_10e8._0_4_);
                        fStack_13a0 = (float)local_10e8._0_4_;
                        fStack_139c = (float)local_10e8._0_4_;
                        uVar5 = *(undefined8 *)*(undefined1 (*) [12])(mm_lookupmask_ps + lVar31);
                        local_1148 = (float)uVar5;
                        fStack_1144 = (float)((ulong)uVar5 >> 0x20);
                        fStack_1140 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar31 + 8);
                        fStack_113c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar31 + 8)
                                             >> 0x20);
                        local_12f8 = fVar123;
                        fStack_12f0 = fVar111;
                        fStack_12ec = fVar109;
                        local_10a8 = fStack_109c;
                        fStack_10a4 = fStack_109c;
                        fStack_10a0 = fStack_109c;
                        while( true ) {
                          fStack_137c = 0.0;
                          fStack_1380 = 0.0;
                          local_1068 = local_11d8[lVar37];
                          fVar81 = local_11c8[lVar37];
                          *(float *)(ray + k * 4 + 0x80) = local_11a8[lVar37 + -4];
                          args.context = context->user;
                          local_1058._4_4_ = fVar81;
                          local_1058._0_4_ = fVar81;
                          fStack_1050 = fVar81;
                          fStack_104c = fVar81;
                          local_1098 = local_11a8[lVar37];
                          uVar30 = *(undefined4 *)(local_1198 + lVar37 * 4);
                          uVar4 = *(undefined4 *)((long)&local_1188 + lVar37 * 4);
                          local_1088._4_4_ = uVar30;
                          local_1088._0_4_ = uVar30;
                          local_1088._8_4_ = uVar30;
                          local_1088._12_4_ = uVar30;
                          local_1078._4_4_ = uVar4;
                          local_1078._0_4_ = uVar4;
                          local_1078._8_4_ = uVar4;
                          local_1078._12_4_ = uVar4;
                          fStack_1094 = local_1098;
                          fStack_1090 = local_1098;
                          fStack_108c = local_1098;
                          fStack_1064 = local_1068;
                          fStack_1060 = local_1068;
                          fStack_105c = local_1068;
                          local_1048 = local_13a8;
                          uStack_1040 = CONCAT44(uVar27,uVar27);
                          local_1038 = CONCAT44(uVar35,uVar35);
                          uStack_1030 = CONCAT44(uVar35,uVar35);
                          local_1028 = (args.context)->instID[0];
                          uStack_1024 = local_1028;
                          uStack_1020 = local_1028;
                          uStack_101c = local_1028;
                          local_1018 = (args.context)->instPrimID[0];
                          uStack_1014 = local_1018;
                          uStack_1010 = local_1018;
                          uStack_100c = local_1018;
                          local_1318._4_4_ = fStack_1144;
                          local_1318._0_4_ = local_1148;
                          local_1318._8_4_ = fStack_1140;
                          local_1318._12_4_ = fStack_113c;
                          args.valid = (int *)local_1318;
                          args.geometryUserPtr = pGVar9->userPtr;
                          args.hit = (RTCHitN *)&local_1098;
                          args.N = 4;
                          pRVar33 = (RTCRayN *)pGVar9->intersectionFilterN;
                          args.ray = (RTCRayN *)ray;
                          if (pRVar33 != (RTCRayN *)0x0) {
                            pRVar33 = (RTCRayN *)(*(code *)pRVar33)(&args);
                          }
                          if (local_1318 == (undefined1  [16])0x0) {
                            auVar94._8_4_ = 0xffffffff;
                            auVar94._0_8_ = 0xffffffffffffffff;
                            auVar94._12_4_ = 0xffffffff;
                            auVar94 = auVar94 ^ _DAT_01f7ae20;
                          }
                          else {
                            pRVar33 = (RTCRayN *)context->args->filter;
                            if ((pRVar33 != (RTCRayN *)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                              pRVar33 = (RTCRayN *)(*(code *)pRVar33)(&args);
                            }
                            auVar67._0_4_ = -(uint)(local_1318._0_4_ == 0);
                            auVar67._4_4_ = -(uint)(local_1318._4_4_ == 0);
                            auVar67._8_4_ = -(uint)(local_1318._8_4_ == 0);
                            auVar67._12_4_ = -(uint)(local_1318._12_4_ == 0);
                            auVar94 = auVar67 ^ _DAT_01f7ae20;
                            if (local_1318 != (undefined1  [16])0x0) {
                              auVar173 = blendvps(*(undefined1 (*) [16])args.hit,
                                                  *(undefined1 (*) [16])(args.ray + 0xc0),auVar67);
                              *(undefined1 (*) [16])(args.ray + 0xc0) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                                  *(undefined1 (*) [16])(args.ray + 0xd0),auVar67);
                              *(undefined1 (*) [16])(args.ray + 0xd0) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                                  *(undefined1 (*) [16])(args.ray + 0xe0),auVar67);
                              *(undefined1 (*) [16])(args.ray + 0xe0) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                                  *(undefined1 (*) [16])(args.ray + 0xf0),auVar67);
                              *(undefined1 (*) [16])(args.ray + 0xf0) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                                  *(undefined1 (*) [16])(args.ray + 0x100),auVar67);
                              *(undefined1 (*) [16])(args.ray + 0x100) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                                  *(undefined1 (*) [16])(args.ray + 0x110),auVar67);
                              *(undefined1 (*) [16])(args.ray + 0x110) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                                  *(undefined1 (*) [16])(args.ray + 0x120),auVar67);
                              *(undefined1 (*) [16])(args.ray + 0x120) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                                  *(undefined1 (*) [16])(args.ray + 0x130),auVar67);
                              *(undefined1 (*) [16])(args.ray + 0x130) = auVar173;
                              auVar173 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                                  *(undefined1 (*) [16])(args.ray + 0x140),auVar67);
                              *(undefined1 (*) [16])(args.ray + 0x140) = auVar173;
                              pRVar33 = args.ray;
                            }
                          }
                          if ((_DAT_01f7bb20 & auVar94) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar49;
                          }
                          else {
                            fVar49 = *(float *)(ray + k * 4 + 0x80);
                          }
                          *(undefined4 *)(local_1318 + lVar37 * 4 + -0x10) = 0;
                          valid.field_0.i[0] =
                               -(uint)(auVar167._0_4_ <= fVar49) & valid.field_0.i[0];
                          valid.field_0.i[1] =
                               -(uint)(auVar167._4_4_ <= fVar49) & valid.field_0.i[1];
                          valid.field_0.i[2] =
                               -(uint)(auVar167._8_4_ <= fVar49) & valid.field_0.i[2];
                          valid.field_0.i[3] =
                               -(uint)(auVar167._12_4_ <= fVar49) & valid.field_0.i[3];
                          iVar29 = movmskps((int)pRVar33,(undefined1  [16])valid.field_0);
                          iVar176 = local_10c8;
                          iVar178 = iStack_10c4;
                          iVar180 = iStack_10c0;
                          iVar28 = iStack_10bc;
                          iVar183 = local_10b8;
                          iVar185 = iStack_10b4;
                          iVar187 = iStack_10b0;
                          iVar189 = iStack_10ac;
                          fVar74 = local_fd8;
                          fVar78 = fStack_fd4;
                          fVar83 = fStack_fd0;
                          fVar160 = fStack_fcc;
                          fVar51 = local_fe8;
                          fVar73 = fStack_fe4;
                          fVar77 = fStack_fe0;
                          fVar52 = fStack_fdc;
                          fVar82 = local_fc8;
                          fVar87 = fStack_fc4;
                          fVar106 = fStack_fc0;
                          fVar166 = fStack_fbc;
                          if (iVar29 == 0) break;
                          auVar60 = blendvps(_DAT_01f7a9f0,auVar167,(undefined1  [16])valid.field_0)
                          ;
                          auVar132._4_4_ = auVar60._0_4_;
                          auVar132._0_4_ = auVar60._4_4_;
                          auVar132._8_4_ = auVar60._12_4_;
                          auVar132._12_4_ = auVar60._8_4_;
                          auVar173 = minps(auVar132,auVar60);
                          auVar95._0_8_ = auVar173._8_8_;
                          auVar95._8_4_ = auVar173._0_4_;
                          auVar95._12_4_ = auVar173._4_4_;
                          auVar173 = minps(auVar95,auVar173);
                          auVar96._0_8_ =
                               CONCAT44(-(uint)(auVar173._4_4_ == auVar60._4_4_) &
                                        valid.field_0.i[1],
                                        -(uint)(auVar173._0_4_ == auVar60._0_4_) &
                                        valid.field_0.i[0]);
                          auVar96._8_4_ =
                               -(uint)(auVar173._8_4_ == auVar60._8_4_) & valid.field_0.i[2];
                          auVar96._12_4_ =
                               -(uint)(auVar173._12_4_ == auVar60._12_4_) & valid.field_0.i[3];
                          iVar28 = movmskps(iVar29,auVar96);
                          aVar68 = valid.field_0;
                          if (iVar28 != 0) {
                            aVar68.i[2] = auVar96._8_4_;
                            aVar68._0_8_ = auVar96._0_8_;
                            aVar68.i[3] = auVar96._12_4_;
                          }
                          uVar30 = movmskps(iVar28,(undefined1  [16])aVar68);
                          uVar34 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar30);
                          lVar37 = 0;
                          if (uVar34 != 0) {
                            for (; (uVar34 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              uVar36 = uVar36 & uVar36 - 1;
            } while (uVar36 != 0);
          }
          local_10f8 = local_10f8 + 1;
          auVar173 = local_1008;
        } while (local_10f8 != local_1100);
      }
      iVar183 = *(int *)(ray + k * 4 + 0x80);
      iVar185 = iVar183;
      iVar187 = iVar183;
      iVar189 = iVar183;
      fVar81 = local_1178;
      fVar123 = fStack_1174;
      fVar113 = fStack_1170;
      fVar151 = fStack_116c;
    }
    pSVar39 = local_1138;
    if (local_1138 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }